

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_main.cpp
# Opt level: O1

void D_AddWildFile(TArray<FString,_FString> *wadfiles,char *value)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  void *handle;
  char *file;
  findstate_t findstate;
  char path [4096];
  findstate_t local_1050;
  char local_1038 [4104];
  
  if ((value != (char *)0x0) && (*value != '\0')) {
    pcVar3 = BaseFileSearch(value,".wad",false);
    if (pcVar3 != (char *)0x0) {
      D_AddFile(wadfiles,pcVar3,true,-1);
      return;
    }
    handle = I_FindFirst(value,&local_1050);
    strcpy(local_1038,value);
    pcVar3 = strrchr(local_1038,0x2f);
    if (pcVar3 == (char *)0x0) {
      pcVar3 = strrchr(local_1038,0x5c);
    }
    if (handle != (void *)0xffffffffffffffff) {
      do {
        uVar1 = I_FindAttr(&local_1050);
        if ((uVar1 & 8) == 0) {
          if (pcVar3 == (char *)0x0) {
            file = local_1050.namelist[local_1050.current]->d_name;
          }
          else {
            strcpy(pcVar3 + 1,local_1050.namelist[local_1050.current]->d_name);
            file = local_1038;
          }
          D_AddFile(wadfiles,file,true,-1);
        }
        iVar2 = I_FindNext(handle,&local_1050);
      } while (iVar2 == 0);
    }
    I_FindClose(handle);
  }
  return;
}

Assistant:

void D_AddWildFile (TArray<FString> &wadfiles, const char *value)
{
	if (value == NULL || *value == '\0')
	{
		return;
	}
	const char *wadfile = BaseFileSearch (value, ".wad");

	if (wadfile != NULL)
	{
		D_AddFile (wadfiles, wadfile);
	}
	else
	{ // Try pattern matching
		findstate_t findstate;
		char path[PATH_MAX];
		char *sep;
		void *handle = I_FindFirst (value, &findstate);

		strcpy (path, value);
		sep = strrchr (path, '/');
		if (sep == NULL)
		{
			sep = strrchr (path, '\\');
#ifdef _WIN32
			if (sep == NULL && path[1] == ':')
			{
				sep = path + 1;
			}
#endif
		}

		if (handle != ((void *)-1))
		{
			do
			{
				if (!(I_FindAttr(&findstate) & FA_DIREC))
				{
					if (sep == NULL)
					{
						D_AddFile (wadfiles, I_FindName (&findstate));
					}
					else
					{
						strcpy (sep+1, I_FindName (&findstate));
						D_AddFile (wadfiles, path);
					}
				}
			} while (I_FindNext (handle, &findstate) == 0);
		}
		I_FindClose (handle);
	}
}